

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O3

void __thiscall TicSpecial::TicSpecial(TicSpecial *this)

{
  void *pvVar1;
  long lVar2;
  
  this->lastmaketic = -1;
  this->specialsize = 0x100;
  memset(this,0,0x120);
  lVar2 = -0x24;
  do {
    pvVar1 = M_Malloc_Dbg(0x100,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/d_net.cpp"
                          ,0xcd);
    this->used[lVar2] = (size_t)pvVar1;
    (&this->streamptr)[lVar2] = (BYTE *)0x0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  this->okay = true;
  return;
}

Assistant:

TicSpecial ()
	{
		int i;

		lastmaketic = -1;
		specialsize = 256;

		for (i = 0; i < BACKUPTICS; i++)
			streams[i] = NULL;

		for (i = 0; i < BACKUPTICS; i++)
		{
			streams[i] = (BYTE *)M_Malloc (256);
			used[i] = 0;
		}
		okay = true;
	}